

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O2

pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
* __thiscall
AddrManImpl::Select_
          (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
           *__return_storage_ptr__,AddrManImpl *this,bool new_only,
          unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
          *networks)

{
  FastRandomContext *this_00;
  AddrInfo *this_01;
  bool use_tried;
  bool bVar1;
  int iVar2;
  int iVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  uint64_t uVar6;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> now;
  int range;
  __node_base *p_Var7;
  long lVar8;
  int iVar9;
  long lVar10;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  *__range2;
  long in_FS_OFFSET;
  double dVar11;
  undefined1 auVar12 [16];
  string_view source_file;
  string_view logging_function;
  double local_88;
  char *local_68;
  nid_type node_id;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_006aaad4;
  }
  else {
    if ((networks->_M_h)._M_element_count == 0) {
      lVar8 = (long)this->nNew;
      lVar10 = (long)this->nTried;
    }
    else {
      p_Var7 = &(networks->_M_h)._M_before_begin;
      lVar10 = 0;
      lVar8 = 0;
      while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
        cVar4 = std::
                _Hashtable<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->m_network_counts)._M_h,(key_type *)(p_Var7 + 1));
        if (cVar4.
            super__Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>.
            _M_cur != (__node_type *)0x0) {
          lVar8 = lVar8 + *(long *)((long)cVar4.
                                          super__Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
                                          ._M_cur + 0x10);
          lVar10 = lVar10 + *(long *)((long)cVar4.
                                            super__Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
                                            ._M_cur + 0x18);
        }
      }
    }
    if ((new_only) && (lVar8 == 0)) {
      lVar8 = *(long *)(in_FS_OFFSET + 0x28);
    }
    else {
      if (lVar8 + lVar10 != 0) {
        use_tried = !new_only && lVar10 != 0;
        if ((!new_only && lVar10 != 0) && (lVar8 != 0)) {
          use_tried = RandomMixin<FastRandomContext>::randbool
                                (&(this->insecure_rand).super_RandomMixin<FastRandomContext>);
        }
        range = 0x400;
        if (use_tried != false) {
          range = 0x100;
        }
        this_00 = &this->insecure_rand;
        local_88 = 1.0;
        do {
          iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                            (&this_00->super_RandomMixin<FastRandomContext>,range);
          iVar3 = RandomMixin<FastRandomContext>::randrange<int>
                            (&this_00->super_RandomMixin<FastRandomContext>,0x40);
          for (iVar9 = 0; iVar9 != 0x40; iVar9 = iVar9 + 1) {
            node_id = GetEntry(this,use_tried,(long)iVar2,(long)((iVar3 + iVar9) % 0x40));
            if (node_id != -1) {
              if ((networks->_M_h)._M_element_count == 0) {
LAB_006aa954:
                cVar5 = std::
                        _Hashtable<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::find(&(this->mapInfo)._M_h,&node_id);
                if (cVar5.super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>._M_cur
                    == (__node_type *)0x0) {
                  __assert_fail("it_found != mapInfo.end()",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                                ,0x30d,
                                "std::pair<CAddress, NodeSeconds> AddrManImpl::Select_(bool, const std::unordered_set<Network> &) const"
                               );
                }
                this_01 = (AddrInfo *)
                          ((long)cVar5.
                                 super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>.
                                 _M_cur + 0x10);
                uVar6 = RandomMixin<FastRandomContext>::randbits<30>
                                  (&this_00->super_RandomMixin<FastRandomContext>);
                auVar12._8_4_ = (int)(uVar6 >> 0x20);
                auVar12._0_8_ = uVar6;
                auVar12._12_4_ = 0x45300000;
                now = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                                ();
                dVar11 = AddrInfo::GetChance(this_01,(NodeSeconds)now.__d.__r);
                if ((auVar12._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0) <
                    dVar11 * local_88 * 1073741824.0) {
                  bVar1 = ::LogAcceptCategory(ADDRMAN,SUB84(now.__d.__r,0));
                  if (bVar1) {
                    CService::ToStringAddrPort_abi_cxx11_(&local_58,(CService *)this_01);
                    local_68 = "new";
                    if (use_tried != false) {
                      local_68 = "tried";
                    }
                    source_file._M_str =
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                    ;
                    source_file._M_len = 0x5b;
                    logging_function._M_str = "Select_";
                    logging_function._M_len = 7;
                    LogPrintFormatInternal<std::__cxx11::string,char_const*>
                              (logging_function,source_file,0x312,ADDRMAN,Debug,
                               (ConstevalFormatString<2U>)0xc8bee0,&local_58,&local_68);
                    std::__cxx11::string::~string((string *)&local_58);
                  }
                  std::
                  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                  ::pair<const_AddrInfo_&,_true>
                            (__return_storage_ptr__,this_01,
                             (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                              *)((long)cVar5.
                                       super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>
                                       ._M_cur + 0x48));
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    return __return_storage_ptr__;
                  }
                  goto LAB_006aaad4;
                }
                local_88 = local_88 * 1.2;
                break;
              }
              cVar5 = std::
                      _Hashtable<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(&(this->mapInfo)._M_h,&node_id);
              if (cVar5.super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>._M_cur !=
                  (__node_type *)0x0) {
                local_58._M_dataplus._M_p._0_4_ =
                     CNetAddr::GetNetwork
                               ((CNetAddr *)
                                ((long)cVar5.
                                       super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>
                                       ._M_cur + 0x10));
                bVar1 = std::
                        unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                        ::contains(networks,(key_type *)&local_58);
                if (bVar1) goto LAB_006aa954;
              }
            }
          }
        } while( true );
      }
      lVar8 = *(long *)(in_FS_OFFSET + 0x28);
    }
    if (lVar8 != local_38) {
LAB_006aaad4:
      __stack_chk_fail();
    }
  }
  std::
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>,_true>
            (__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::pair<CAddress, NodeSeconds> AddrManImpl::Select_(bool new_only, const std::unordered_set<Network>& networks) const
{
    AssertLockHeld(cs);

    if (vRandom.empty()) return {};

    size_t new_count = nNew;
    size_t tried_count = nTried;

    if (!networks.empty()) {
        new_count = 0;
        tried_count = 0;
        for (auto& network : networks) {
            auto it = m_network_counts.find(network);
            if (it == m_network_counts.end()) {
                continue;
            }
            auto counts = it->second;
            new_count += counts.n_new;
            tried_count += counts.n_tried;
        }
    }

    if (new_only && new_count == 0) return {};
    if (new_count + tried_count == 0) return {};

    // Decide if we are going to search the new or tried table
    // If either option is viable, use a 50% chance to choose
    bool search_tried;
    if (new_only || tried_count == 0) {
        search_tried = false;
    } else if (new_count == 0) {
        search_tried = true;
    } else {
        search_tried = insecure_rand.randbool();
    }

    const int bucket_count{search_tried ? ADDRMAN_TRIED_BUCKET_COUNT : ADDRMAN_NEW_BUCKET_COUNT};

    // Loop through the addrman table until we find an appropriate entry
    double chance_factor = 1.0;
    while (1) {
        // Pick a bucket, and an initial position in that bucket.
        int bucket = insecure_rand.randrange(bucket_count);
        int initial_position = insecure_rand.randrange(ADDRMAN_BUCKET_SIZE);

        // Iterate over the positions of that bucket, starting at the initial one,
        // and looping around.
        int i, position;
        nid_type node_id;
        for (i = 0; i < ADDRMAN_BUCKET_SIZE; ++i) {
            position = (initial_position + i) % ADDRMAN_BUCKET_SIZE;
            node_id = GetEntry(search_tried, bucket, position);
            if (node_id != -1) {
                if (!networks.empty()) {
                    const auto it{mapInfo.find(node_id)};
                    if (Assume(it != mapInfo.end()) && networks.contains(it->second.GetNetwork())) break;
                } else {
                    break;
                }
            }
        }

        // If the bucket is entirely empty, start over with a (likely) different one.
        if (i == ADDRMAN_BUCKET_SIZE) continue;

        // Find the entry to return.
        const auto it_found{mapInfo.find(node_id)};
        assert(it_found != mapInfo.end());
        const AddrInfo& info{it_found->second};

        // With probability GetChance() * chance_factor, return the entry.
        if (insecure_rand.randbits<30>() < chance_factor * info.GetChance() * (1 << 30)) {
            LogDebug(BCLog::ADDRMAN, "Selected %s from %s\n", info.ToStringAddrPort(), search_tried ? "tried" : "new");
            return {info, info.m_last_try};
        }

        // Otherwise start over with a (likely) different bucket, and increased chance factor.
        chance_factor *= 1.2;
    }
}